

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfp_helper.c
# Opt level: O2

void ADD_PPs(PPC_DFP *dfp)

{
  dfp_set_FPRF_from_FRT(dfp);
  dfp_check_for_OX(dfp);
  dfp_check_for_UX(dfp);
  dfp_check_for_XX(dfp);
  dfp_check_for_VXSNAN(dfp);
  dfp_check_for_VXISI(dfp,0);
  return;
}

Assistant:

static void ADD_PPs(struct PPC_DFP *dfp)
{
    dfp_set_FPRF_from_FRT(dfp);
    dfp_check_for_OX(dfp);
    dfp_check_for_UX(dfp);
    dfp_check_for_XX(dfp);
    dfp_check_for_VXSNAN(dfp);
    dfp_check_for_VXISI_add(dfp);
}